

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

void __thiscall PArray::WriteValue(PArray *this,FArchive *ar,void *addr)

{
  uint local_2c;
  void *pvStack_28;
  uint i;
  BYTE *addrb;
  void *addr_local;
  FArchive *ar_local;
  PArray *this_local;
  
  FArchive::WriteByte(ar,'\x0f');
  FArchive::WriteCount(ar,this->ElementCount);
  pvStack_28 = addr;
  for (local_2c = 0; local_2c < this->ElementCount; local_2c = local_2c + 1) {
    (*(this->ElementType->super_DObject)._vptr_DObject[7])(this->ElementType,ar,pvStack_28);
    pvStack_28 = (void *)((long)pvStack_28 + (ulong)this->ElementSize);
  }
  return;
}

Assistant:

void PArray::WriteValue(FArchive &ar, const void *addr) const
{
	ar.WriteByte(VAL_Array);
	ar.WriteCount(ElementCount);
	const BYTE *addrb = (const BYTE *)addr;
	for (unsigned i = 0; i < ElementCount; ++i)
	{
		ElementType->WriteValue(ar, addrb);
		addrb += ElementSize;
	}
}